

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Visualizer.cpp
# Opt level: O2

Vector4 * __thiscall iDynTree::ColorViz::toVector4(ColorViz *this)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  Vector4 *in_RDI;
  
  uVar1 = this->r;
  uVar3 = this->g;
  in_RDI->m_data[0] = (double)(float)uVar1;
  in_RDI->m_data[1] = (double)(float)uVar3;
  uVar2 = this->b;
  uVar4 = this->a;
  in_RDI->m_data[2] = (double)(float)uVar2;
  in_RDI->m_data[3] = (double)(float)uVar4;
  return in_RDI;
}

Assistant:

Vector4 ColorViz::toVector4() const
{
    Vector4 ret;
    ret(0) = r;
    ret(1) = g;
    ret(2) = b;
    ret(3) = a;
    return ret;
}